

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68020_mull(m68k_info *info)

{
  m68k_reg mVar1;
  m68k_reg mVar2;
  m68k_info *info_00;
  long in_RDI;
  uint reg_1;
  uint reg_0;
  cs_m68k_op *op1;
  cs_m68k_op *op0;
  cs_m68k *ext;
  uint insn_signed;
  uint extension;
  uint in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  undefined8 in_stack_ffffffffffffffd8;
  m68k_op_mem *op;
  m68k_info *in_stack_ffffffffffffffe0;
  
  if ((*(uint *)(in_RDI + 0x28) & 0x1c) == 0) {
    d68000_invalid((m68k_info *)0x3a0da3);
  }
  else {
    mVar1 = read_imm_16((m68k_info *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    info_00 = (m68k_info *)
              build_init_op(in_stack_ffffffffffffffe0,
                            (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                            (int)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
    op = &(info_00->extension).operands[0].mem;
    get_ea_mode_op(info_00,(cs_m68k_op *)op,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
    mVar2 = mVar1 >> 0xc & M68K_REG_D6;
    ((m68k_op_br_disp *)(op + 1))[3].disp = 0;
    *(undefined4 *)((long)((m68k_op_br_disp *)(op + 1) + 2) + 4) = 7;
    op->base_reg = mVar1 & M68K_REG_D6;
    op->index_reg = mVar2;
    if ((mVar1 & 0x400) == M68K_REG_INVALID) {
      *(undefined4 *)((long)((m68k_op_br_disp *)(op + 1) + 2) + 4) = 1;
      op->base_reg = mVar2 + M68K_REG_D0;
    }
  }
  return;
}

Assistant:

static void d68020_mull(m68k_info *info)
{
	uint extension, insn_signed;
	cs_m68k* ext;
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	uint reg_0, reg_1;


	LIMIT_CPU_TYPES(info, M68020_PLUS);

	extension = read_imm_16(info);
	insn_signed = 0;

	if (BIT_B((extension)))
		insn_signed = 1;

	ext = build_init_op(info, insn_signed ? M68K_INS_MULS : M68K_INS_MULU, 2, 4);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	get_ea_mode_op(info, op0, info->ir, 4);

	reg_0 = extension & 7;
	reg_1 = (extension >> 12) & 7;

	op1->address_mode = M68K_AM_NONE;
	op1->type = M68K_OP_REG_PAIR;
	op1->reg_pair.reg_0 = reg_0;
	op1->reg_pair.reg_1 = reg_1;

	if (!BIT_A(extension)) {
		op1->type = M68K_OP_REG;
		op1->reg = M68K_REG_D0 + reg_1;
	}
}